

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::swap
          (PropertyT<OpenMesh::VectorT<double,_3>_> *this,size_t _i0,size_t _i1)

{
  reference __a;
  reference __b;
  size_t _i1_local;
  size_t _i0_local;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_local;
  
  __a = std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        operator[](&this->data_,_i0);
  __b = std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        operator[](&this->data_,_i1);
  std::swap<OpenMesh::VectorT<double,3>>(__a,__b);
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }